

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O0

void __thiscall
JsrtRuntime::SetBeforeCollectCallback
          (JsrtRuntime *this,JsBeforeCollectCallback beforeCollectCallback,void *callbackContext)

{
  CollectCallBack *pCVar1;
  void *callbackContext_local;
  JsBeforeCollectCallback beforeCollectCallback_local;
  JsrtRuntime *this_local;
  
  if (beforeCollectCallback == (JsBeforeCollectCallback)0x0) {
    if ((this->collectCallback != (CollectCallBack *)0x0) &&
       (this->beforeSweepCallback == (JsBeforeSweepCallback)0x0)) {
      ThreadContext::RemoveRecyclerCollectCallBack(this->threadContext,this->collectCallback);
      this->collectCallback = (CollectCallBack *)0x0;
    }
    this->beforeCollectCallback = (JsBeforeCollectCallback)0x0;
    this->beforeCollectCallbackContext = (void *)0x0;
  }
  else {
    if (this->collectCallback == (CollectCallBack *)0x0) {
      pCVar1 = ThreadContext::AddRecyclerCollectCallBack
                         (this->threadContext,RecyclerCollectCallbackStatic,this);
      this->collectCallback = pCVar1;
    }
    this->beforeCollectCallback = beforeCollectCallback;
    this->beforeCollectCallbackContext = callbackContext;
  }
  return;
}

Assistant:

void JsrtRuntime::SetBeforeCollectCallback(JsBeforeCollectCallback beforeCollectCallback, void * callbackContext)
{
    if (beforeCollectCallback != nullptr)
    {
        if (this->collectCallback == nullptr)
        {
            this->collectCallback = this->threadContext->AddRecyclerCollectCallBack(RecyclerCollectCallbackStatic, this);
        }

        this->beforeCollectCallback = beforeCollectCallback;
        this->beforeCollectCallbackContext = callbackContext;
    }
    else
    {
        if (this->collectCallback != nullptr
#ifdef _CHAKRACOREBUILD
            && this->beforeSweepCallback == nullptr
#endif
            )
        {
            this->threadContext->RemoveRecyclerCollectCallBack(this->collectCallback);
            this->collectCallback = nullptr;
        }

        this->beforeCollectCallback = nullptr;
        this->beforeCollectCallbackContext = nullptr;
    }
}